

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall groundupdb::EncodedValue::EncodedValue(EncodedValue *this,string *from)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this->m_has_value = true;
  this->m_type = CPP;
  std::__cxx11::string::string((string *)&local_30,(string *)from);
  HashedValue::HashedValue<std::__cxx11::string>(&this->m_value,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

EncodedValue(const std::string& from) : m_has_value(true), m_type(Type::CPP), m_value(HashedValue{from}) {}